

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O1

void boost::deflate::deflate_stream_test::testFlushPartial(ICompressor *c)

{
  uint extraout_var;
  uint extraout_var_00;
  string out;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  (**c->_vptr_ICompressor)();
  local_28 = 0;
  local_20 = 0;
  local_30 = &local_20;
  std::__cxx11::string::resize((ulong)&local_30,'\0');
  (*c->_vptr_ICompressor[5])(c,"Hello");
  (*c->_vptr_ICompressor[3])(c,5);
  (*c->_vptr_ICompressor[9])(c,local_30);
  (*c->_vptr_ICompressor[7])(c,local_28);
  (*c->_vptr_ICompressor[0xc])(c,0);
  (**(code **)(*test_suite::detail::current()::p + 0x28 + (ulong)(extraout_var & 1) * 8))
            (test_suite::detail::current()::p,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1f0,
             "static void boost::deflate::deflate_stream_test::testFlushPartial(ICompressor &)");
  (*c->_vptr_ICompressor[0xc])(c,2);
  (**(code **)(*test_suite::detail::current()::p + 0x28 + (ulong)((extraout_var_00 & 1) != 0) * 8))
            (test_suite::detail::current()::p,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1f2,
             "static void boost::deflate::deflate_stream_test::testFlushPartial(ICompressor &)");
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return;
}

Assistant:

static
    void testFlushPartial(ICompressor& c)
    {
        c.init();
        std::string out;
        out.resize(1024);
        string_view s = "Hello";
        c.next_in(s.data());
        c.avail_in(s.size());
        c.next_out(&out.front());
        c.avail_out(out.size());
        error_code ec;
        ec = c.write(Flush::none);
        BOOST_TEST(!ec);
        ec = c.write(Flush::partial);
        BOOST_TEST(!ec);
    }